

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err setDoubleValueNum(econf_file *ef,size_t num,void *v)

{
  int iVar1;
  char *local_38;
  char *ptr;
  double *value;
  void *v_local;
  size_t num_local;
  econf_file *ef_local;
  
  ptr = (char *)v;
  value = (double *)v;
  v_local = (void *)num;
  num_local = (size_t)ef;
  iVar1 = asprintf(&local_38,"%.*g",*v,0x11);
  if (iVar1 == -1) {
    ef_local._4_4_ = ECONF_NOMEM;
  }
  else {
    if (*(long *)(*(long *)num_local + (long)v_local * 0x38 + 0x10) != 0) {
      free(*(void **)(*(long *)num_local + (long)v_local * 0x38 + 0x10));
    }
    *(char **)(*(long *)num_local + (long)v_local * 0x38 + 0x10) = local_38;
    ef_local._4_4_ = ECONF_SUCCESS;
  }
  return ef_local._4_4_;
}

Assistant:

econf_err setStringValueNum(econf_file *ef, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : "");
  char *ptr;

  if ((ptr = strdup (value)) == NULL)
    return ECONF_NOMEM;

  if (ef->file_entry[num].value)
    free(ef->file_entry[num].value);

  ef->file_entry[num].value = ptr;

  return ECONF_SUCCESS;
}